

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecBitwiseAnd(Parser *this)

{
  CompileContext *pCVar1;
  _Head_base<0UL,_enact::Expr_*,_false> _Var2;
  bool bVar3;
  Parser *in_RSI;
  _Head_base<0UL,_enact::Expr_*,_false> local_70;
  undefined1 local_68 [8];
  Token oper;
  
  parsePrecAdd(this);
  while( true ) {
    bVar3 = consume(in_RSI,AMPERSAND);
    if (!bVar3) break;
    Token::Token(&oper,&in_RSI->m_previous);
    parsePrecAdd((Parser *)local_68);
    std::
    make_unique<enact::BinaryExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_70,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,(Token *)local_68)
    ;
    _Var2._M_head_impl = local_70._M_head_impl;
    local_70._M_head_impl = (Expr *)0x0;
    pCVar1 = this->m_context;
    this->m_context = (CompileContext *)_Var2._M_head_impl;
    if (pCVar1 != (CompileContext *)0x0) {
      (**(code **)((pCVar1->m_source)._M_dataplus._M_p + 8))();
      if ((CompileContext *)local_70._M_head_impl != (CompileContext *)0x0) {
        (**(code **)((((string *)&(local_70._M_head_impl)->_vptr_Expr)->_M_dataplus)._M_p + 8))();
      }
    }
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_68)->_M_dataplus)._M_p + 8))();
    }
    std::__cxx11::string::~string((string *)&oper.lexeme);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecBitwiseAnd() {
        std::unique_ptr<Expr> expr = parsePrecAdd();

        while (consume(TokenType::AMPERSAND)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecAdd();
            expr = std::make_unique<BinaryExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }